

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct32_stage6_avx2(__m256i *bf1,__m256i *cospim32,__m256i *cospi32,__m256i *cospim16,
                       __m256i *cospi48,__m256i *cospi16,__m256i *cospim48,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rounding,int bit)

{
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i *in_RCX;
  __m256i *in_RDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  __m256i *in_R8;
  __m256i *in_R9;
  longlong in_XMM0_Qa;
  longlong lVar1;
  longlong lVar2;
  longlong in_XMM0_Qb;
  longlong lVar3;
  longlong lVar4;
  longlong in_YMM0_H;
  longlong lVar5;
  longlong lVar6;
  __m256i *in_register_00001218;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  __m256i *clamp_hi_00;
  int bit_00;
  __m256i *in_stack_ffffffffffffffd0;
  __m256i in_stack_ffffffffffffffd8;
  
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  lVar1 = in_XMM0_Qa;
  lVar3 = in_XMM0_Qb;
  lVar5 = in_YMM0_H;
  clamp_hi_00 = in_register_00001218;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20));
  in_RDI[6][0] = lVar1;
  in_RDI[6][1] = lVar3;
  in_RDI[6][2] = lVar5;
  in_RDI[6][3] = (longlong)in_register_00001218;
  in_RDI[5][0] = in_XMM0_Qa;
  in_RDI[5][1] = in_XMM0_Qb;
  in_RDI[5][2] = in_YMM0_H;
  in_RDI[5][3] = (longlong)clamp_hi_00;
  in1[1] = (longlong)in_RSI;
  in1[0] = (longlong)in_RDX;
  in1[2] = (longlong)in_RDI;
  in1[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_00[1] = (longlong)in_RSI;
  in1_00[0] = (longlong)in_RDX;
  in1_00[2] = (longlong)in_RDI;
  in1_00[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_00,in_RCX,in_R8,in_R9,clamp_hi_00);
  in1_01[1] = (longlong)in_RSI;
  in1_01[0] = (longlong)in_RDX;
  in1_01[2] = (longlong)in_RDI;
  in1_01[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_01,in_RCX,in_R8,in_R9,clamp_hi_00);
  lVar1 = in_RDI[0xe][0];
  lVar3 = in_RDI[0xe][1];
  lVar5 = in_RDI[0xe][2];
  lVar7 = in_RDI[0xe][3];
  in1_02[1] = (longlong)in_RSI;
  in1_02[0] = (longlong)in_RDX;
  in1_02[2] = (longlong)in_RDI;
  in1_02[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_02,in_RCX,in_R8,in_R9,clamp_hi_00);
  bit_00 = (int)((ulong)in_R8 >> 0x20);
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar2 = lVar1;
  lVar4 = lVar3;
  lVar6 = lVar5;
  lVar8 = lVar7;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1d][0] = lVar2;
  in_RDI[0x1d][1] = lVar4;
  in_RDI[0x1d][2] = lVar6;
  in_RDI[0x1d][3] = lVar7;
  in_RDI[0x12][0] = lVar1;
  in_RDI[0x12][1] = lVar3;
  in_RDI[0x12][2] = lVar5;
  in_RDI[0x12][3] = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar7 = lVar1;
  lVar2 = lVar3;
  lVar4 = lVar5;
  lVar6 = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1c][0] = lVar7;
  in_RDI[0x1c][1] = lVar2;
  in_RDI[0x1c][2] = lVar4;
  in_RDI[0x1c][3] = lVar6;
  in_RDI[0x13][0] = lVar1;
  in_RDI[0x13][1] = lVar3;
  in_RDI[0x13][2] = lVar5;
  in_RDI[0x13][3] = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar7 = lVar1;
  lVar2 = lVar3;
  lVar4 = lVar5;
  lVar9 = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1b][0] = lVar7;
  in_RDI[0x1b][1] = lVar2;
  in_RDI[0x1b][2] = lVar4;
  in_RDI[0x1b][3] = lVar8;
  in_RDI[0x14][0] = lVar1;
  in_RDI[0x14][1] = lVar3;
  in_RDI[0x14][2] = lVar5;
  in_RDI[0x14][3] = lVar9;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar7 = lVar1;
  lVar2 = lVar3;
  lVar4 = lVar5;
  lVar6 = lVar9;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1a][0] = lVar7;
  in_RDI[0x1a][1] = lVar2;
  in_RDI[0x1a][2] = lVar4;
  in_RDI[0x1a][3] = lVar6;
  in_RDI[0x15][0] = lVar1;
  in_RDI[0x15][1] = lVar3;
  in_RDI[0x15][2] = lVar5;
  in_RDI[0x15][3] = lVar9;
  return;
}

Assistant:

static inline void idct32_stage6_avx2(
    __m256i *bf1, const __m256i *cospim32, const __m256i *cospi32,
    const __m256i *cospim16, const __m256i *cospi48, const __m256i *cospi16,
    const __m256i *cospim48, const __m256i *clamp_lo, const __m256i *clamp_hi,
    const __m256i *rounding, int bit) {
  __m256i temp1, temp2;
  temp1 = half_btf_avx2(cospim32, &bf1[5], cospi32, &bf1[6], rounding, bit);
  bf1[6] = half_btf_avx2(cospi32, &bf1[5], cospi32, &bf1[6], rounding, bit);
  bf1[5] = temp1;

  addsub_avx2(bf1[8], bf1[11], bf1 + 8, bf1 + 11, clamp_lo, clamp_hi);
  addsub_avx2(bf1[9], bf1[10], bf1 + 9, bf1 + 10, clamp_lo, clamp_hi);
  addsub_avx2(bf1[15], bf1[12], bf1 + 15, bf1 + 12, clamp_lo, clamp_hi);
  addsub_avx2(bf1[14], bf1[13], bf1 + 14, bf1 + 13, clamp_lo, clamp_hi);

  temp1 = half_btf_avx2(cospim16, &bf1[18], cospi48, &bf1[29], rounding, bit);
  bf1[29] = half_btf_avx2(cospi48, &bf1[18], cospi16, &bf1[29], rounding, bit);
  bf1[18] = temp1;
  temp2 = half_btf_avx2(cospim16, &bf1[19], cospi48, &bf1[28], rounding, bit);
  bf1[28] = half_btf_avx2(cospi48, &bf1[19], cospi16, &bf1[28], rounding, bit);
  bf1[19] = temp2;
  temp1 = half_btf_avx2(cospim48, &bf1[20], cospim16, &bf1[27], rounding, bit);
  bf1[27] = half_btf_avx2(cospim16, &bf1[20], cospi48, &bf1[27], rounding, bit);
  bf1[20] = temp1;
  temp2 = half_btf_avx2(cospim48, &bf1[21], cospim16, &bf1[26], rounding, bit);
  bf1[26] = half_btf_avx2(cospim16, &bf1[21], cospi48, &bf1[26], rounding, bit);
  bf1[21] = temp2;
}